

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall ON_Viewport::GetFrustumLeftPlane(ON_Viewport *this,ON_Plane *left_plane)

{
  double dVar1;
  bool bVar2;
  ON_2dVector v;
  ON_3dVector OStack_88;
  ON_3dVector local_70;
  ON_3dVector local_58;
  ON_2dVector local_40;
  
  bVar2 = false;
  if ((this->m_bValidCamera == true) && (bVar2 = false, (this->m_bValidFrustum & 1U) != 0)) {
    if (this->m_projection == perspective_view) {
      ON_2dVector::ON_2dVector(&local_40,this->m_frus_near,this->m_frus_left);
      bVar2 = ON_2dVector::Unitize(&local_40);
      (left_plane->origin).z = (this->m_CamLoc).z;
      dVar1 = (this->m_CamLoc).y;
      (left_plane->origin).x = (this->m_CamLoc).x;
      (left_plane->origin).y = dVar1;
      ::operator*(&OStack_88,local_40.y,&this->m_CamX);
      ::operator*(&local_58,local_40.x,&this->m_CamZ);
      ON_3dVector::operator-(&local_70,&OStack_88,&local_58);
      (left_plane->xaxis).z = local_70.z;
      (left_plane->xaxis).x = local_70.x;
      (left_plane->xaxis).y = local_70.y;
      (left_plane->yaxis).z = (this->m_CamY).z;
      dVar1 = (this->m_CamY).y;
      (left_plane->yaxis).x = (this->m_CamY).x;
      (left_plane->yaxis).y = dVar1;
      ::operator*(&OStack_88,local_40.x,&this->m_CamX);
      ::operator*(&local_58,local_40.y,&this->m_CamZ);
      ON_3dVector::operator+(&local_70,&OStack_88,&local_58);
      (left_plane->zaxis).z = local_70.z;
      (left_plane->zaxis).x = local_70.x;
      (left_plane->zaxis).y = local_70.y;
    }
    else {
      ::operator*(&OStack_88,this->m_frus_left,&this->m_CamX);
      ON_3dPoint::operator+((ON_3dPoint *)&local_70,&this->m_CamLoc,&OStack_88);
      (left_plane->origin).z = local_70.z;
      (left_plane->origin).x = local_70.x;
      (left_plane->origin).y = local_70.y;
      ON_3dVector::operator-(&local_70,&this->m_CamZ);
      (left_plane->xaxis).z = local_70.z;
      (left_plane->xaxis).x = local_70.x;
      (left_plane->xaxis).y = local_70.y;
      (left_plane->yaxis).z = (this->m_CamY).z;
      dVar1 = (this->m_CamY).y;
      (left_plane->yaxis).x = (this->m_CamY).x;
      (left_plane->yaxis).y = dVar1;
      dVar1 = (this->m_CamX).y;
      (left_plane->zaxis).x = (this->m_CamX).x;
      (left_plane->zaxis).y = dVar1;
      (left_plane->zaxis).z = (this->m_CamX).z;
      bVar2 = true;
    }
    ON_Plane::UpdateEquation(left_plane);
  }
  return bVar2;
}

Assistant:

bool ON_Viewport::GetFrustumLeftPlane( 
  ON_Plane& left_plane 
  ) const
{
  bool rc = m_bValidCamera && m_bValidFrustum;
  if (rc)
  {
    if ( IsPerspectiveProjection() )
    {
      ON_2dVector v(m_frus_near,m_frus_left);
      rc = v.Unitize();
      left_plane.origin = m_CamLoc;
      left_plane.xaxis =  v.y*m_CamX - v.x*m_CamZ;
      left_plane.yaxis =  m_CamY;
      left_plane.zaxis =  v.x*m_CamX + v.y*m_CamZ;
    }
    else
    {
      left_plane.origin = m_CamLoc + m_frus_left*m_CamX;
      left_plane.xaxis = -m_CamZ;
      left_plane.yaxis =  m_CamY;
      left_plane.zaxis =  m_CamX;
    }
    left_plane.UpdateEquation();
  }
  return rc;
}